

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::addToSystemMenu
          (QMdiSubWindowPrivate *this,WindowStateAction action,QString *text,char *slot)

{
  bool bVar1;
  QAction *p;
  undefined8 in_RCX;
  QPointer<QAction> *in_RDX;
  undefined4 in_ESI;
  QMdiSubWindowPrivate *in_RDI;
  QWidget *unaff_retaddr;
  ConnectionType type;
  QPointer<QAction> *member;
  undefined4 in_stack_fffffffffffffff0;
  QMdiSubWindowPrivate *text_00;
  
  type = (ConnectionType)((ulong)in_RCX >> 0x20);
  text_00 = in_RDI;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x62e8b1);
  if (bVar1) {
    p = (QAction *)QPointer<QMenu>::operator->((QPointer<QMenu> *)0x62e8c8);
    member = in_RDX;
    q_func(in_RDI);
    QWidget::addAction(unaff_retaddr,(QString *)text_00,
                       (QObject *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)member,type);
    QPointer<QAction>::operator=(in_RDX,p);
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::addToSystemMenu(WindowStateAction action, const QString &text,
                                           const char *slot)
{
    if (!systemMenu)
        return;
    actions[action] = systemMenu->addAction(text, q_func(), slot);
}